

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolUDP.cpp
# Opt level: O2

DataBuffer * __thiscall ProtocolUDP::GetTxBuffer(ProtocolUDP *this,InterfaceMAC *mac)

{
  DataBuffer *pDVar1;
  
  pDVar1 = ProtocolIPv4::GetTxBuffer(this->IP,mac);
  if (pDVar1 != (DataBuffer *)0x0) {
    pDVar1->Packet = pDVar1->Packet + 8;
    pDVar1->Remainder = pDVar1->Remainder - 8;
  }
  return pDVar1;
}

Assistant:

DataBuffer* ProtocolUDP::GetTxBuffer(InterfaceMAC* mac)
{
    DataBuffer* buffer;

    buffer = IP.GetTxBuffer(mac);
    if (buffer != nullptr)
    {
        buffer->Packet += header_size();
        buffer->Remainder -= header_size();
    }

    return buffer;
}